

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O2

void __thiscall ObjectParser::parseLine(ObjectParser *this,string *line,int section)

{
  char cVar1;
  Network *pNVar2;
  bool bVar3;
  int iVar4;
  InputError *pIVar5;
  ulong uVar6;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string s2;
  undefined1 local_50 [8];
  string s1;
  
  local_50 = (undefined1  [8])&s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  local_78 = (undefined1  [8])&s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  s2._M_string_length._0_1_ = 0;
  if ((this->super_InputParser).network != (Network *)0x0) {
    for (uVar6 = 0; uVar6 < line->_M_string_length; uVar6 = uVar6 + 1) {
      cVar1 = (line->_M_dataplus)._M_p[uVar6];
      if ((cVar1 == '\t') || (cVar1 == ' ')) {
        if (s1._M_dataplus._M_p != (pointer)0x0) break;
      }
      else {
        std::__cxx11::string::push_back((char)local_50);
      }
    }
    switch(section) {
    case 1:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_358,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_358);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_198,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,NODE,0,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_338,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_338);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 2:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_318,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_318);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_178,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,NODE,2,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_2f8,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_2f8);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 3:
      iVar4 = Network::indexOf((this->super_InputParser).network,NODE,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_2d8,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_2d8);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_158,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,NODE,1,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_2b8,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_2b8);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 4:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_298,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_298);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_138,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,LINK,0,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_278,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_278);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 5:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_258,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_258);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_118,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,LINK,1,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_238,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_238);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 6:
      iVar4 = Network::indexOf((this->super_InputParser).network,LINK,(string *)local_50);
      if (-1 < iVar4) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_218,(string *)local_50);
        InputError::InputError(pIVar5,4,&local_218);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pNVar2 = (this->super_InputParser).network;
      std::__cxx11::string::string((string *)&local_f8,(string *)local_50);
      bVar3 = Network::addElement(pNVar2,LINK,2,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_1f8,(string *)local_50);
        InputError::InputError(pIVar5,1,&local_1f8);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      break;
    case 7:
      iVar4 = Network::indexOf((this->super_InputParser).network,PATTERN,(string *)local_50);
      if (iVar4 < 0) {
        for (; uVar6 < line->_M_string_length; uVar6 = uVar6 + 1) {
          cVar1 = (line->_M_dataplus)._M_p[uVar6];
          if ((cVar1 == '\t') || (cVar1 == ' ')) {
            if (s2._M_dataplus._M_p != (pointer)0x0) break;
          }
          else {
            std::__cxx11::string::push_back((char)local_78);
          }
        }
        std::__cxx11::string::string
                  ((string *)&local_d8,"VARIABLE",(allocator *)(s2.field_2._M_local_buf + 0xf));
        bVar3 = Utilities::match((string *)local_78,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        pNVar2 = (this->super_InputParser).network;
        std::__cxx11::string::string((string *)&local_b8,(string *)local_50);
        bVar3 = Network::addElement(pNVar2,PATTERN,(uint)bVar3,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_1d8,(string *)local_50);
          InputError::InputError(pIVar5,1,&local_1d8);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
      break;
    case 8:
      iVar4 = Network::indexOf((this->super_InputParser).network,CURVE,(string *)local_50);
      if (iVar4 < 0) {
        pNVar2 = (this->super_InputParser).network;
        std::__cxx11::string::string((string *)&local_98,(string *)local_50);
        bVar3 = Network::addElement(pNVar2,CURVE,0,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_1b8,(string *)local_50);
          InputError::InputError(pIVar5,1,&local_1b8);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ObjectParser::parseLine(string& line, int section)
{
    string s1;
    string s2;
    int    type = 0;

    // ... read first string token from input line

    if (network == 0) return;
    int i = 0;
    for (; i < line.length(); i++)
    {
        char chLine = line[i];
        if (chLine == ' ' || chLine == '\t')
        {
            if (s1.empty())
                continue;
            else
                break;
        }
        else
        {
            s1 += chLine;
        }
    }

    // ... create new object whose type is determined by current file section

    switch(section)
    {
    case InputReader::JUNCTION:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::JUNCTION, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::RESERVOIR:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::RESERVOIR, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::TANK:
        if ( network->indexOf(Element::NODE, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::NODE, Node::TANK, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PIPE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PIPE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PUMP:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::PUMP, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::VALVE:
        if ( network->indexOf(Element::LINK, s1) >= 0 )
        {
            throw InputError(InputError::DUPLICATE_ID, s1);
        }
        if ( !network->addElement(Element::LINK, Link::VALVE, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::PATTERN:
        // Check if pattern already created
        if ( network->indexOf(Element::PATTERN, s1 ) >= 0) break;

        // Check if pattern is Fixed or Variable
        for (; i < line.length(); i++)
        {
            char chLine = line[i];
            if (chLine == ' ' || chLine == '\t')
            {
                if (s2.empty())
                    continue;
                else
                    break;
            }
            else
            {
                s2 += chLine;
            }
        }
        type = Pattern::FIXED_PATTERN;
        if (Utilities::match(s2, w_Variable)) type = Pattern::VARIABLE_PATTERN;

        if ( !network->addElement(Element::PATTERN, type, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

    case InputReader::CURVE:
        // Check if curve already created
        if ( network->indexOf(Element::CURVE, s1) >= 0 ) break;
        if ( !network->addElement(Element::CURVE, 0, s1) )
        {
            throw InputError(InputError::CANNOT_CREATE_OBJECT, s1);
        }
        break;

/*
    case InputReader::RULE:
        // Check for Rule keyword
        if (Utilities::match(s1, w_Rule))
        {
            // Parse rule's name
            sin >> s2;
            if (sin.fail()) return InputError::TOO_FEW_ITEMS;

            // Check if rule with same name already exists
            if (network->indexOf(Element::CONTROL, s2) >= 0)
                return InputError::DUPLICATE_ID;

            // Add new rule
            network->addElement(Element::CONTROL, s2);
        }
        break;
*/
    }
}